

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O2

void jsoncons::jsonpointer::
     flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parent_key,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent_value,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result)

{
  json_type jVar1;
  bool bVar2;
  size_t sVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent_value_00;
  size_t i;
  ulong value;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  string_type key;
  string_type key_1;
  
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type(parent_value);
  if (jVar1 == object_value) {
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(parent_value);
    if (!bVar2) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                ((const_object_range_type *)&key,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)parent_value);
      while( true ) {
        bVar2 = (byte)key._M_string_length == key.field_2._M_local_buf[8];
        if (((byte)key._M_string_length & key.field_2._M_local_buf[8] & 1) != 0) {
          bVar2 = key._M_dataplus._M_p == (pointer)key.field_2._M_allocated_capacity;
        }
        if (bVar2) break;
        std::__cxx11::string::string((string *)&key_1,(string *)parent_key);
        std::__cxx11::string::push_back((char)&key_1);
        local_80._M_str = *(char **)key._M_dataplus._M_p;
        local_80._M_len = *(size_t *)(key._M_dataplus._M_p + 8);
        escape<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                  (&local_80,&key_1);
        flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  (&key_1,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          (key._M_dataplus._M_p + 0x20),result);
        std::__cxx11::string::~string((string *)&key_1);
        key._M_dataplus._M_p = key._M_dataplus._M_p + 0x30;
      }
      return;
    }
  }
  else if ((jVar1 == array_value) &&
          (bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty
                             (parent_value), !bVar2)) {
    for (value = 0;
        sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(parent_value)
        , value < sVar3; value = value + 1) {
      std::__cxx11::string::string((string *)&key,(string *)parent_key);
      std::__cxx11::string::push_back((char)&key);
      jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>(value,&key);
      parent_value_00 =
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(parent_value,value);
      flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                (&key,parent_value_00,result);
      std::__cxx11::string::~string((string *)&key);
    }
    return;
  }
  key_1._M_string_length = (size_type)(parent_key->_M_dataplus)._M_p;
  key_1._M_dataplus._M_p = (pointer)parent_key->_M_string_length;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
            ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
              *)&key,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)result,
             (string_view_type *)&key_1,parent_value);
  return;
}

Assistant:

void flatten_(const std::basic_string<typename Json::char_type>& parent_key,
                  const Json& parent_value,
                  Json& result)
    {
        using char_type = typename Json::char_type;
        using string_type = std::basic_string<char_type>;

        switch (parent_value.type())
        {
            case json_type::array_value:
            {
                if (parent_value.empty())
                {
                    // Flatten empty array to null
                    //result.try_emplace(parent_key, null_type{});
                    //result[parent_key] = parent_value;
                    result.try_emplace(parent_key, parent_value);
                }
                else
                {
                    for (std::size_t i = 0; i < parent_value.size(); ++i)
                    {
                        string_type key(parent_key);
                        key.push_back('/');
                        jsoncons::detail::from_integer(i,key);
                        flatten_(key, parent_value.at(i), result);
                    }
                }
                break;
            }

            case json_type::object_value:
            {
                if (parent_value.empty())
                {
                    // Flatten empty object to null
                    //result.try_emplace(parent_key, null_type{});
                    //result[parent_key] = parent_value;
                    result.try_emplace(parent_key, parent_value);
                }
                else
                {
                    for (const auto& item : parent_value.object_range())
                    {
                        string_type key(parent_key);
                        key.push_back('/');
                        escape(jsoncons::basic_string_view<char_type>(item.key().data(),item.key().size()), key);
                        flatten_(key, item.value(), result);
                    }
                }
                break;
            }

            default:
            {
                // add primitive parent_value with its reference string
                //result[parent_key] = parent_value;
                result.try_emplace(parent_key, parent_value);
                break;
            }
        }
    }